

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentmap.h
# Opt level: O2

void quicly_sentmap_init_iter(quicly_sentmap_t *map,quicly_sentmap_iter_t *iter)

{
  st_quicly_sent_block_t *psVar1;
  quicly_sent_acked_cb p_Var2;
  size_t sVar3;
  quicly_sent_t *pqVar4;
  
  iter->ref = &map->head;
  psVar1 = map->head;
  if (psVar1 == (st_quicly_sent_block_t *)0x0) {
    iter->p = &quicly_sentmap__end_iter;
    sVar3 = 0;
  }
  else {
    sVar3 = psVar1->num_entries;
    if (sVar3 == 0) {
      __assert_fail("map->head->num_entries != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/sentmap.h"
                    ,0x12f,
                    "void quicly_sentmap_init_iter(quicly_sentmap_t *, quicly_sentmap_iter_t *)");
    }
    pqVar4 = (quicly_sent_t *)((long)&psVar1[-1].entries[0xf].data + 0x10);
    do {
      p_Var2 = pqVar4[1].acked;
      pqVar4 = pqVar4 + 1;
    } while (p_Var2 == (quicly_sent_acked_cb)0x0);
    iter->p = pqVar4;
    if (p_Var2 != quicly_sentmap__type_packet) {
      __assert_fail("iter->p->acked == quicly_sentmap__type_packet",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/sentmap.h"
                    ,0x132,
                    "void quicly_sentmap_init_iter(quicly_sentmap_t *, quicly_sentmap_iter_t *)");
    }
  }
  iter->count = sVar3;
  return;
}

Assistant:

inline void quicly_sentmap_init_iter(quicly_sentmap_t *map, quicly_sentmap_iter_t *iter)
{
    /* set up the iterator */
    iter->ref = &map->head;
    if (map->head != NULL) {
        assert(map->head->num_entries != 0);
        for (iter->p = map->head->entries; iter->p->acked == NULL; ++iter->p)
            ;
        assert(iter->p->acked == quicly_sentmap__type_packet);
        iter->count = map->head->num_entries;
    } else {
        iter->p = (quicly_sent_t *)&quicly_sentmap__end_iter;
        iter->count = 0;
    }
}